

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gabby.cc
# Opt level: O3

void __thiscall GB::StepPPU_Mode3(GB *this,Tick mode_tick)

{
  u8 *puVar1;
  byte bVar2;
  byte *pbVar3;
  byte bVar4;
  u8 uVar5;
  uint uVar6;
  ushort uVar7;
  uint uVar8;
  
  if (0x169 < mode_tick) {
    __assert_fail("mode_tick < 362",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/binji[P]gabby/src/gabby.cc"
                  ,0x72a,"void GB::StepPPU_Mode3(Tick)");
  }
  if (0x59 < (mode_tick << 0x3e | (ulong)mode_tick >> 2)) goto switchD_0010afae_caseD_18;
  uVar6 = (&switchD_0010afae::switchdataD_0010d970)[(ulong)mode_tick >> 2] + 0x10d970;
  switch(mode_tick) {
  case 0:
  case 1:
  case 2:
  case 3:
    uVar6 = (uint)(this->s).io[0x40];
    if ((this->s).ppu_window == true) {
      uVar5 = -(this->s).io[0x4a];
      uVar8 = (uVar6 & 0x40) << 4;
    }
    else {
      uVar5 = (this->s).io[0x42];
      uVar8 = (uint)((this->s).io[0x43] >> 3) | (uVar6 & 8) << 7;
    }
    bVar4 = (this->s).ppu_line_y + uVar5;
    (this->s).ppu_draw_y = bVar4;
    uVar6 = (uint)(bVar4 & 0xf8) << 2;
    goto code_r0x0010b1a0;
  default:
    uVar6._0_1_ = (this->s).ppu_draw_y;
    uVar6._1_1_ = (this->s).ppu_map;
    uVar6._2_1_ = (this->s).ppu_tile[0];
    uVar6._3_1_ = (this->s).ppu_tile[1];
    bVar4 = (this->s).ppu_map;
    uVar7 = (ushort)bVar4 << 4;
    if (((this->s).io[0x40] & 0x10) == 0) {
      uVar7 = (char)bVar4 * 0x10 + 0x1000;
    }
    (this->s).ppu_tile_addr = uVar7 + (short)(uVar6 & 7) * 2 + 1;
    (this->s).ppu_next_tile[0] = (this->s).vram[(uint)uVar7 + (uVar6 & 7) * 2];
    break;
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x44:
  case 0x45:
  case 0x46:
  case 0x47:
  case 0x54:
  case 0x55:
  case 0x56:
  case 0x57:
  case 100:
  case 0x65:
  case 0x66:
  case 0x67:
  case 0x74:
  case 0x75:
  case 0x76:
  case 0x77:
  case 0x84:
  case 0x85:
  case 0x86:
  case 0x87:
  case 0x94:
  case 0x95:
  case 0x96:
  case 0x97:
  case 0xa4:
  case 0xa5:
  case 0xa6:
  case 0xa7:
  case 0xb4:
  case 0xb5:
  case 0xb6:
  case 0xb7:
  case 0xc4:
  case 0xc5:
  case 0xc6:
  case 199:
  case 0xd4:
  case 0xd5:
  case 0xd6:
  case 0xd7:
  case 0xe4:
  case 0xe5:
  case 0xe6:
  case 0xe7:
  case 0xf4:
  case 0xf5:
  case 0xf6:
  case 0xf7:
  case 0x104:
  case 0x105:
  case 0x106:
  case 0x107:
  case 0x114:
  case 0x115:
  case 0x116:
  case 0x117:
  case 0x124:
  case 0x125:
  case 0x126:
  case 0x127:
  case 0x134:
  case 0x135:
  case 0x136:
  case 0x137:
  case 0x144:
  case 0x145:
  case 0x146:
  case 0x147:
  case 0x154:
  case 0x155:
  case 0x156:
  case 0x157:
  case 0x164:
  case 0x165:
  case 0x166:
  case 0x167:
    (this->s).ppu_next_tile[1] = (this->s).vram[(this->s).ppu_tile_addr];
    break;
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
    if ((this->s).ppu_window != false) goto switchD_0010afae_caseD_1c;
    uVar6 = (uint)(this->s).ppu_map_addr;
    goto LAB_0010b067;
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x38:
  case 0x39:
  case 0x3a:
  case 0x3b:
  case 0x48:
  case 0x49:
  case 0x4a:
  case 0x4b:
  case 0x58:
  case 0x59:
  case 0x5a:
  case 0x5b:
  case 0x68:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x78:
  case 0x79:
  case 0x7a:
  case 0x7b:
  case 0x88:
  case 0x89:
  case 0x8a:
  case 0x8b:
  case 0x98:
  case 0x99:
  case 0x9a:
  case 0x9b:
  case 0xa8:
  case 0xa9:
  case 0xaa:
  case 0xab:
  case 0xb8:
  case 0xb9:
  case 0xba:
  case 0xbb:
  case 200:
  case 0xc9:
  case 0xca:
  case 0xcb:
  case 0xd8:
  case 0xd9:
  case 0xda:
  case 0xdb:
  case 0xe8:
  case 0xe9:
  case 0xea:
  case 0xeb:
  case 0xf8:
  case 0xf9:
  case 0xfa:
  case 0xfb:
  case 0x108:
  case 0x109:
  case 0x10a:
  case 0x10b:
  case 0x118:
  case 0x119:
  case 0x11a:
  case 0x11b:
  case 0x128:
  case 0x129:
  case 0x12a:
  case 299:
  case 0x138:
  case 0x139:
  case 0x13a:
  case 0x13b:
  case 0x148:
  case 0x149:
  case 0x14a:
  case 0x14b:
  case 0x158:
  case 0x159:
  case 0x15a:
  case 0x15b:
    break;
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
  case 0x2c:
  case 0x2d:
  case 0x2e:
  case 0x2f:
  case 0x3c:
  case 0x3d:
  case 0x3e:
  case 0x3f:
  case 0x4c:
  case 0x4d:
  case 0x4e:
  case 0x4f:
  case 0x5c:
  case 0x5d:
  case 0x5e:
  case 0x5f:
  case 0x6c:
  case 0x6d:
  case 0x6e:
  case 0x6f:
  case 0x7c:
  case 0x7d:
  case 0x7e:
  case 0x7f:
  case 0x8c:
  case 0x8d:
  case 0x8e:
  case 0x8f:
  case 0x9c:
  case 0x9d:
  case 0x9e:
  case 0x9f:
  case 0xac:
  case 0xad:
  case 0xae:
  case 0xaf:
  case 0xbc:
  case 0xbd:
  case 0xbe:
  case 0xbf:
  case 0xcc:
  case 0xcd:
  case 0xce:
  case 0xcf:
  case 0xdc:
  case 0xdd:
  case 0xde:
  case 0xdf:
  case 0xec:
  case 0xed:
  case 0xee:
  case 0xef:
  case 0xfc:
  case 0xfd:
  case 0xfe:
  case 0xff:
  case 0x10c:
  case 0x10d:
  case 0x10e:
  case 0x10f:
  case 0x11c:
  case 0x11d:
  case 0x11e:
  case 0x11f:
  case 300:
  case 0x12d:
  case 0x12e:
  case 0x12f:
  case 0x13c:
  case 0x13d:
  case 0x13e:
  case 0x13f:
  case 0x14c:
  case 0x14d:
  case 0x14e:
  case 0x14f:
  case 0x15c:
  case 0x15d:
  case 0x15e:
  case 0x15f:
switchD_0010afae_caseD_1c:
    uVar6 = *(uint *)&(this->s).ppu_map_addr;
    uVar6 = uVar6 + 1 & 0x1f | uVar6 & 0xffffffe0;
    (this->s).ppu_map_addr = (u16)uVar6;
LAB_0010b067:
    (this->s).ppu_map = (this->s).vram[uVar6 & 0xffff];
    *(undefined2 *)(this->s).ppu_tile = *(undefined2 *)(this->s).ppu_next_tile;
    break;
  case 0x168:
  case 0x169:
    uVar8 = (uint)CONCAT71(0x10d9,*(char *)&(this->rom).
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_start + 'p');
code_r0x0010b1a0:
    (this->s).ppu_map_addr = (short)(uVar8 | uVar6) + 0x1800;
    (this->s).ppu_map = (this->s).vram[(ulong)(uVar8 | uVar6) + 0x1800];
  }
switchD_0010afae_caseD_18:
  if (((this->s).tick & 1) != 0) {
    uVar5 = (this->s).ppu_stall;
    if (uVar5 == '\0') {
      bVar4 = (this->s).ppu_tile[1];
      bVar2 = (this->s).io[0x47];
      pbVar3 = (this->s).ppu_pixel;
      (this->s).ppu_pixel = pbVar3 + 1;
      *pbVar3 = bVar2 >> ((this->s).ppu_tile[0] >> 7 | bVar4 >> 6 & 2) * '\x02' & 3;
      uVar5 = (this->s).ppu_line_x + '\x01';
      (this->s).ppu_line_x = uVar5;
      if (uVar5 == 0xa0) {
        bVar4 = (this->s).io[0x41];
        (this->s).io[0x41] = bVar4 & 0xfc;
        (this->s).ppu_mode = '\0';
        (this->s).ppu_mode_start_tick = (this->s).tick + 1;
        if ((bVar4 & 8) != 0) {
          puVar1 = (this->s).io + 0xf;
          *puVar1 = *puVar1 | 2;
        }
      }
    }
    else {
      (this->s).ppu_stall = uVar5 + 0xff;
    }
    puVar1 = (this->s).ppu_tile;
    *puVar1 = *puVar1 << 1;
    puVar1 = (this->s).ppu_tile + 1;
    *puVar1 = *puVar1 << 1;
    if (((((this->s).ppu_window == false) && (((this->s).io[0x40] & 0x20) != 0)) &&
        ((this->s).io[0x4a] <= (this->s).ppu_line_y)) &&
       ((ulong)(this->s).io[0x4b] * 2 + 0xc == mode_tick)) {
      (this->s).ppu_stall = '\x06';
      (this->s).ppu_mode_start_tick = (this->s).tick + 2;
      (this->s).ppu_window = true;
    }
  }
  return;
}

Assistant:

void GB::StepPPU_Mode3(Tick mode_tick) {
  assert(mode_tick < 362);
  switch (mode_tick) {
    case 0: {
      if (s.ppu_window) {
        s.ppu_draw_y = s.ppu_line_y - s.io[WY];
        s.ppu_map_addr = (s.io[LCDC] & 0x40) << 4;
      } else {
        s.ppu_draw_y = s.ppu_line_y + s.io[SCY];
        s.ppu_map_addr = ((s.io[LCDC] & 8) << 7) | ((s.io[SCX] & 0xf8) >> 3);
      }
      s.ppu_map_addr |= 0x1800 | ((s.ppu_draw_y & 0xf8) << 2);
      s.ppu_map = s.vram[s.ppu_map_addr];
      break;
    }

    case 12:
      if (!s.ppu_window) { goto no_increment; }
      // Fallthrough.

    case 28: case 44: case 60: case 76: case 92: case 108:
    case 124: case 140: case 156: case 172: case 188: case 204: case 220:
    case 236: case 252: case 268: case 284: case 300: case 316: case 332:
    case 348:
      s.ppu_map_addr = (s.ppu_map_addr & ~31) | ((s.ppu_map_addr + 1) & 31);

    no_increment:
      // Next map addr.
      s.ppu_map = s.vram[s.ppu_map_addr];
      s.ppu_tile[0] = s.ppu_next_tile[0];
      s.ppu_tile[1] = s.ppu_next_tile[1];
      break;

    case 4: case 16: case 32: case 48: case 64: case 80: case 96: case 112:
    case 128: case 144: case 160: case 176: case 192: case 208: case 224:
    case 240: case 256: case 272: case 288: case 304: case 320: case 336:
    case 352:
      // Fetch plane 0.
      s.ppu_tile_addr = (s.ppu_draw_y & 0x7) << 1;
      if (s.io[LCDC] & 0x10) {
        s.ppu_tile_addr |= (s.ppu_map << 4);
      } else {
        s.ppu_tile_addr |= (0x1000 + ((s16)(s8)s.ppu_map << 4));
      }
      s.ppu_next_tile[0] = s.vram[s.ppu_tile_addr++];
      break;

    case 8: case 20: case 36: case 52: case 68: case 84: case 100: case 116:
    case 132: case 148: case 164: case 180: case 196: case 212: case 228:
    case 244: case 260: case 276: case 292: case 308: case 324: case 340:
    case 356:
      // Fetch plane 1.
      s.ppu_next_tile[1] = s.vram[s.ppu_tile_addr];
      break;

    case 24: case 40: case 56: case 72: case 88: case 104: case 120:
    case 136: case 152: case 168: case 184: case 200: case 216: case 232:
    case 248: case 264: case 280: case 296: case 312: case 328: case 344:
    case 360:
      // Sprite window.
      break;
  }

  if (falling(s.tick)) {
    if (s.ppu_stall == 0) {
      u8 pal_index = ((s.ppu_tile[1] >> 6) & 2) | (s.ppu_tile[0] >> 7);
      *s.ppu_pixel++ = (s.io[BGP] >> (pal_index * 2)) & 3;
      if (++s.ppu_line_x == 160) {
        SetPPUMode(0);
      }
    } else {
      --s.ppu_stall;
    }

    s.ppu_tile[0] <<= 1;
    s.ppu_tile[1] <<= 1;

    if (!s.ppu_window && (s.io[LCDC] & 0x20) && s.ppu_line_y >= s.io[WY] &&
        mode_tick == (s.io[WX] + 6) * 2) {
      s.ppu_stall = 6;
      s.ppu_mode_start_tick = s.tick + 2;
      s.ppu_window = true;
    }
  }
}